

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O0

int __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::open
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this,char *__file,
          int __oflag,...)

{
  int extraout_EAX;
  service_type *this_00;
  implementation_type *__file_00;
  error_code ec;
  char *in_stack_ffffffffffffffb8;
  undefined1 local_20 [16];
  char *local_10;
  basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *local_8;
  
  local_10 = __file;
  local_8 = this;
  CLI::std::error_code::error_code((error_code *)this);
  this_00 = asio::detail::
            io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
            ::get_service(&this->impl_);
  __file_00 = asio::detail::
              io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
              ::get_implementation(&this->impl_);
  asio::detail::reactive_socket_service<asio::ip::tcp>::open
            (this_00,(char *)__file_00,(int)local_10,local_20);
  asio::detail::throw_error((error_code *)this,in_stack_ffffffffffffffb8);
  return extraout_EAX;
}

Assistant:

void open(const protocol_type& protocol = protocol_type())
  {
    asio::error_code ec;
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
  }